

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O1

string * adios2::helper::GetFQDN_abi_cxx11_(void)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  string *in_RDI;
  addrinfo *paVar3;
  addrinfo *info;
  char hostname [1024];
  addrinfo *local_450;
  addrinfo local_448;
  char local_418 [1023];
  undefined1 local_19;
  
  local_19 = 0;
  gethostname(local_418,0x3ff);
  local_448.ai_addrlen = 0;
  local_448._20_4_ = 0;
  local_448.ai_addr = (sockaddr *)0x0;
  local_448.ai_canonname = (char *)0x0;
  local_448.ai_next = (addrinfo *)0x0;
  local_448.ai_socktype = 1;
  local_448.ai_protocol = 0;
  local_448.ai_flags = 2;
  local_448.ai_family = 0;
  iVar1 = getaddrinfo(local_418,(char *)0x0,&local_448,&local_450);
  paVar3 = local_450;
  if (iVar1 == 0) {
    for (; paVar3 != (addrinfo *)0x0; paVar3 = paVar3->ai_next) {
      __s = paVar3->ai_canonname;
      pcVar2 = strchr(__s,0x2e);
      if (pcVar2 != (char *)0x0) {
        strncpy(local_418,__s,0x3ff);
        break;
      }
    }
  }
  else {
    builtin_strncpy(local_418,"Unknown_Host_Name",0x12);
  }
  freeaddrinfo(local_450);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_418);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string GetFQDN() noexcept
{
    char hostname[1024];
#ifdef WIN32
    TCHAR infoBuf[1024];
    DWORD bufCharCount = sizeof(hostname);
    memset(hostname, 0, sizeof(hostname));
    if (GetComputerName(infoBuf, &bufCharCount))
    {
        int i;
        for (i = 0; i < sizeof(hostname); i++)
        {
            hostname[i] = infoBuf[i];
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
#else
    struct addrinfo hints, *info, *p;

    hostname[1023] = '\0';
    gethostname(hostname, 1023);

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_flags = AI_CANONNAME;

    if (getaddrinfo(hostname, NULL, &hints, &info) == 0)
    {
        for (p = info; p != NULL; p = p->ai_next)
        {
            // printf("hostname: %s\n", p->ai_canonname);
            if (strchr(p->ai_canonname, '.') != NULL)
            {
                strncpy(hostname, p->ai_canonname, sizeof(hostname) - 1);
                break;
            }
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
    freeaddrinfo(info);
#endif
    return std::string(hostname);
}